

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_game.cxx
# Opt level: O2

void __thiscall xray_re::xr_level_game::load(xr_level_game *this,xr_reader *r)

{
  xr_reader *s;
  xr_reader *local_18;
  
  local_18 = xr_reader::open_chunk(r,0x1000);
  if (local_18 != (xr_reader *)0x0) {
    xr_reader::
    r_chunks<std::vector<xray_re::way_path*,std::allocator<xray_re::way_path*>>,xray_re::way_path_io>
              (local_18,&this->m_paths);
    xr_reader::close_chunk(r,&local_18);
  }
  local_18 = xr_reader::open_chunk(r,0x2000);
  if (local_18 != (xr_reader *)0x0) {
    xr_reader::
    r_chunks<std::vector<xray_re::mp_rpoint*,std::allocator<xray_re::mp_rpoint*>>,xray_re::mp_rpoint_io>
              (local_18,&this->m_rpoints);
    xr_reader::close_chunk(r,&local_18);
  }
  return;
}

Assistant:

void xr_level_game::load(xr_reader& r)
{
	xr_reader* s = r.open_chunk(GAME_CHUNK_WAYS);
	if (s) {
		s->r_chunks(m_paths, way_path_io());
		r.close_chunk(s);
	}
	s = r.open_chunk(GAME_CHUNK_RPOINTS);
	if (s) {
		s->r_chunks(m_rpoints, mp_rpoint_io());
		r.close_chunk(s);
	}
}